

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.h
# Opt level: O2

void __thiscall DIS::DataStream::WriteAlgorithm<short>(DataStream *this,short t)

{
  short t_local;
  
  t_local = t;
  DoFlip(this,(char *)&t_local,2);
  DoWrite(this,(char *)&t_local,2);
  this->_write_pos = this->_write_pos + 2;
  return;
}

Assistant:

void WriteAlgorithm(T t)
      {
         char* ch = reinterpret_cast<char*>( &t );
         DoFlip( ch , sizeof(T) );
         DoWrite( ch , sizeof(T) );
         IncrementPointer<T>( _write_pos );
      }